

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O2

Matrix * viewport(Matrix *__return_storage_ptr__,float x,float y,float w,float h)

{
  vector<float,_std::allocator<float>_> *pvVar1;
  
  Matrix::identity(__return_storage_ptr__,4);
  pvVar1 = Matrix::operator[](__return_storage_ptr__,0);
  (pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_start[3] = x + w * 0.5;
  pvVar1 = Matrix::operator[](__return_storage_ptr__,1);
  (pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_start[3] = y + h * 0.5;
  pvVar1 = Matrix::operator[](__return_storage_ptr__,2);
  (pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_start[3] = 127.5;
  pvVar1 = Matrix::operator[](__return_storage_ptr__,0);
  *(pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
   _M_start = w * 0.5;
  pvVar1 = Matrix::operator[](__return_storage_ptr__,1);
  (pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_start[1] = h * 0.5;
  pvVar1 = Matrix::operator[](__return_storage_ptr__,2);
  (pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_start[2] = 127.5;
  return __return_storage_ptr__;
}

Assistant:

Matrix viewport(float x, float y, float w, float h) {
    Matrix Viewport = Matrix::identity(4);
    Viewport[0][3] = x+w/2.f;
    Viewport[1][3] = y+h/2.f;
    Viewport[2][3] = depth/2.f;
    Viewport[0][0] = w/2.f;
    Viewport[1][1] = h/2.f;
    Viewport[2][2] = depth/2.f;
    return Viewport;
}